

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O0

void __thiscall
Minisat::vec<Minisat::lbool,_int>::capacity(vec<Minisat::lbool,_int> *this,Size min_cap)

{
  Size SVar1;
  int iVar2;
  void *pvVar3;
  int *piVar4;
  undefined8 uVar5;
  int in_ESI;
  undefined8 *in_RDI;
  Size size_max;
  Size add;
  
  if (in_ESI <= *(int *)((long)in_RDI + 0xc)) {
    return;
  }
  SVar1 = max((in_ESI - *(int *)((long)in_RDI + 0xc)) + 1U & 0xfffffffe,
              (*(int *)((long)in_RDI + 0xc) >> 1) + 2U & 0xfffffffe);
  if (SVar1 <= 0x7fffffff - *(int *)((long)in_RDI + 0xc)) {
    iVar2 = SVar1 + *(int *)((long)in_RDI + 0xc);
    *(int *)((long)in_RDI + 0xc) = iVar2;
    pvVar3 = realloc((void *)*in_RDI,(long)iVar2);
    *in_RDI = pvVar3;
    if (pvVar3 != (void *)0x0) {
      return;
    }
    piVar4 = __errno_location();
    if (*piVar4 != 0xc) {
      return;
    }
  }
  uVar5 = __cxa_allocate_exception(1);
  __cxa_throw(uVar5,&OutOfMemoryException::typeinfo,0);
}

Assistant:

void vec<T,_Size>::capacity(Size min_cap) {
    if (cap >= min_cap) return;
    Size add = max((min_cap - cap + 1) & ~1, ((cap >> 1) + 2) & ~1);   // NOTE: grow by approximately 3/2
    const Size size_max = std::numeric_limits<Size>::max();
    if ( ((size_max <= std::numeric_limits<int>::max()) && (add > size_max - cap))
    ||   (((data = (T*)::realloc(data, (cap += add) * sizeof(T))) == NULL) && errno == ENOMEM) )
        throw OutOfMemoryException();
 }